

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpack-to-json.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  _Alloc_hider slice;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  int iVar9;
  char *pcVar10;
  UnsupportedTypeBehavior UVar11;
  int iVar12;
  size_type sVar13;
  char *pcVar14;
  bool bVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  string s;
  string infile;
  Dumper dumper;
  CharBufferSink sink;
  Buffer<char> buffer;
  ifstream ifs;
  ofstream ofs;
  uint local_83c8;
  char *local_83c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_83b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8398;
  char *local_8378;
  Options local_8370;
  Dumper local_8340;
  Sink local_8328;
  Buffer<char> *local_8320;
  Buffer<char> local_8318;
  long local_8240;
  size_type local_8238;
  int aiStack_8220 [122];
  undefined1 local_8038 [8];
  size_type local_8030;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8028 [14];
  ios_base local_7f40 [32528];
  
  local_8378 = "/proc/self/fd/1";
  if (argc < 2) {
    UVar11 = ConvertUnsupportedType;
    bVar15 = true;
    pcVar10 = "-";
    bVar3 = false;
    bVar4 = true;
  }
  else {
    bVar18 = true;
    uVar16 = 1;
    local_83c0 = (char *)0x0;
    pcVar14 = (char *)0x0;
    bVar15 = true;
    bVar4 = true;
    bVar3 = false;
    local_83c8 = 0x111001;
    do {
      pcVar10 = argv[uVar16];
      if (bVar18) {
        iVar6 = strcmp(pcVar10,"--help");
        if (iVar6 == 0) {
          usage(argv);
          return 0;
        }
        iVar6 = strcmp(pcVar10,"--pretty");
        if (iVar6 == 0) {
          bVar15 = true;
        }
        else {
          iVar6 = strcmp(pcVar10,"--no-pretty");
          if (iVar6 == 0) {
            bVar15 = false;
          }
          else {
            iVar6 = strcmp(pcVar10,"--print-unsupported");
            if (iVar6 == 0) {
              local_83c8 = 1;
            }
            else {
              iVar6 = strcmp(pcVar10,"--no-print-unsupported");
              if (iVar6 == 0) {
                local_83c8 = 0;
              }
              else {
                iVar6 = strcmp(pcVar10,"--hex");
                if (iVar6 == 0) {
                  bVar3 = true;
                }
                else {
                  iVar6 = strcmp(pcVar10,"--validate");
                  if (iVar6 == 0) {
                    bVar4 = true;
                  }
                  else {
                    iVar6 = strcmp(pcVar10,"--no-validate");
                    if (iVar6 != 0) {
                      if (((*pcVar10 != '-') || (pcVar10[1] != '-')) || (pcVar10[2] != '\0'))
                      goto LAB_00103da1;
                      bVar18 = false;
                      pcVar10 = local_83c0;
                      goto LAB_00103dfc;
                    }
                    bVar4 = false;
                  }
                }
              }
            }
          }
        }
        bVar18 = true;
        pcVar10 = local_83c0;
      }
      else {
LAB_00103da1:
        if ((local_83c0 != (char *)0x0) &&
           (bVar17 = pcVar14 != (char *)0x0, pcVar14 = pcVar10, pcVar10 = local_83c0, bVar17)) {
          usage(argv);
          return 1;
        }
      }
LAB_00103dfc:
      local_83c0 = pcVar10;
      uVar16 = uVar16 + 1;
    } while ((uint)argc != uVar16);
    UVar11 = FailOnUnsupportedType - (local_83c8 & 1);
    pcVar10 = "-";
    if (local_83c0 != (char *)0x0) {
      pcVar10 = local_83c0;
    }
    if (pcVar14 != (char *)0x0) {
      if (*pcVar14 == '+') {
        bVar18 = pcVar14[1] == '\0';
        local_8378 = "/proc/self/fd/1";
        if (!bVar18) {
          local_8378 = pcVar14;
        }
      }
      else {
        bVar18 = false;
        local_8378 = pcVar14;
      }
      goto LAB_00103e32;
    }
  }
  bVar18 = true;
LAB_00103e32:
  local_8398._M_dataplus._M_p = (pointer)&local_8398.field_2;
  sVar7 = strlen(pcVar10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8398,pcVar10,pcVar10 + sVar7);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_8398,"-");
  if (iVar6 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_8398,0,local_8398._M_string_length,"/proc/self/fd/0",0xf);
  }
  local_83b8._M_dataplus._M_p = (pointer)&local_83b8.field_2;
  local_83b8._M_string_length = 0;
  local_83b8.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&local_8240,(string *)&local_8398,_S_in);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot read infile \'",0x14);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_8398._M_dataplus._M_p,
                        local_8398._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    iVar6 = 1;
    std::ostream::flush();
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_83b8,0x8000);
    while (*(int *)((long)aiStack_8220 + *(long *)(local_8240 + -0x18)) == 0) {
      std::istream::read((char *)&local_8240,(long)local_8038);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_83b8,local_8038,local_8238);
    }
    std::ifstream::close();
    if (bVar3) {
      local_8030 = 0;
      local_8028[0]._M_local_buf[0] = '\0';
      local_8038 = (undefined1  [8])local_8028;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8038,
                 local_83b8._M_string_length);
      sVar2 = local_83b8._M_string_length;
      if (local_83b8._M_string_length != 0) {
        sVar13 = 0;
        iVar6 = -1;
        do {
          bVar1 = local_83b8._M_dataplus._M_p[sVar13];
          iVar9 = -1;
          if ((char)bVar1 < 0x30) goto LAB_00104473;
          iVar12 = -0x30;
          if (bVar1 < 0x3a) {
LAB_00104434:
            iVar9 = iVar12 + (char)bVar1;
            if (iVar6 != -1) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_8038,(char)iVar9 + (char)(iVar6 << 4));
              iVar9 = -1;
            }
          }
          else if (bVar1 < 0x61) {
            iVar12 = -0x37;
            if ((byte)(bVar1 + 0xbf) < 6) goto LAB_00104434;
          }
          else {
            iVar12 = -0x57;
            if (bVar1 < 0x67) goto LAB_00104434;
          }
LAB_00104473:
          sVar13 = sVar13 + 1;
          iVar6 = iVar9;
        } while (sVar2 != sVar13);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_83b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8038);
      if (local_8038 != (undefined1  [8])local_8028) {
        operator_delete((void *)local_8038,
                        CONCAT71(local_8028[0]._M_allocated_capacity._1_7_,
                                 local_8028[0]._M_local_buf[0]) + 1);
      }
    }
    pcVar10 = local_8378;
    local_8370.paddingBehavior = Flexible;
    local_8370.buildUnindexedArrays = false;
    local_8370.buildUnindexedObjects = false;
    local_8370.singleLinePrettyPrint = false;
    local_8370.keepTopLevelOpen = false;
    local_8370.attributeTranslator = (AttributeTranslator *)0x0;
    local_8370.customTypeHandler._0_5_ = 0;
    local_8370.customTypeHandler._5_3_ = 0;
    local_8370.clearBuilderBeforeParse = true;
    local_8370.escapeForwardSlashes = false;
    local_8370.escapeControl = true;
    local_8370.escapeUnicode = false;
    local_8370.dumpAttributesInIndexOrder = true;
    local_8370.unsupportedDoublesAsString = false;
    local_8370.binaryAsHex = false;
    local_8370.datesAsIntegers = false;
    local_8370.disallowExternals = false;
    local_8370.disallowCustom = false;
    local_8370.disallowTags = false;
    local_8370.disallowBCD = false;
    local_8370.debugTags = false;
    local_8370.nestingLimit = 0xffffffff;
    local_8370.validateUtf8Strings = true;
    local_8370.checkAttributeUniqueness = true;
    local_8370.unsupportedTypeBehavior = UVar11;
    local_8370.prettyPrint = bVar15;
    if (bVar4) {
      arangodb::velocypack::Validator::Validator((Validator *)local_8038,&local_8370);
      arangodb::velocypack::Validator::validate
                ((Validator *)local_8038,(uint8_t *)local_83b8._M_dataplus._M_p,
                 local_83b8._M_string_length,false);
    }
    slice._M_p = local_83b8._M_dataplus._M_p;
    arangodb::velocypack::Buffer<char>::Buffer(&local_8318,0x1000);
    local_8328._vptr_Sink = (_func_int **)&PTR__Sink_00119c40;
    local_8320 = &local_8318;
    arangodb::velocypack::Dumper::Dumper(&local_8340,&local_8328,&local_8370);
    arangodb::velocypack::Dumper::dump(&local_8340,(Slice)slice._M_p);
    std::ofstream::ofstream(local_8038,pcVar10,_S_out);
    cVar5 = std::__basic_file<char>::is_open();
    if (cVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot write outfile \'",0x16);
      sVar7 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
      std::ostream::put('\0');
      iVar6 = 1;
      std::ostream::flush();
    }
    else {
      if (!bVar18) {
        std::ostream::seekp(local_8038,0,0);
      }
      std::ostream::write(local_8038,(long)local_8318._buffer);
      std::ofstream::close();
      iVar6 = 0;
      if (!bVar18) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Successfully converted JSON infile \'",0x24);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_8398._M_dataplus._M_p,
                            local_8398._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"VPack Infile size: ",0x13);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"JSON Outfile size: ",0x13);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = 0;
      }
    }
    local_8038 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_8038 + *(long *)(_VTT->_M_local_buf + -0x18)) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&local_8030);
    std::ios_base::~ios_base(local_7f40);
    if (local_8318._buffer != local_8318._local) {
      free(local_8318._buffer);
    }
  }
  std::ifstream::~ifstream(&local_8240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_83b8._M_dataplus._M_p != &local_83b8.field_2) {
    operator_delete(local_83b8._M_dataplus._M_p,
                    CONCAT71(local_83b8.field_2._M_allocated_capacity._1_7_,
                             local_83b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8398._M_dataplus._M_p != &local_8398.field_2) {
    operator_delete(local_8398._M_dataplus._M_p,local_8398.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  char const* outfileName = nullptr;
  bool allowFlags = true;
  bool pretty = true;
  bool printUnsupported = true;
  bool hex = false;
  bool validate = true;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--pretty")) {
      pretty = true;
    } else if (allowFlags && isOption(p, "--no-pretty")) {
      pretty = false;
    } else if (allowFlags && isOption(p, "--print-unsupported")) {
      printUnsupported = true;
    } else if (allowFlags && isOption(p, "--no-print-unsupported")) {
      printUnsupported = false;
    } else if (allowFlags && isOption(p, "--hex")) {
      hex = true;
    } else if (allowFlags && isOption(p, "--validate")) {
      validate = true;
    } else if (allowFlags && isOption(p, "--no-validate")) {
      validate = false;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else if (outfileName == nullptr) {
      outfileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

#ifdef __linux__
  // treat missing outfile as stdout
  bool toStdOut = false;
  if (outfileName == nullptr || strcmp(outfileName, "+") == 0) {
    outfileName = "/proc/self/fd/1";
    toStdOut = true;
  }
#else
  bool const toStdOut = false;
  if (outfileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }
#endif

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  {
    char buffer[32768];
    s.reserve(sizeof(buffer));

    while (ifs.good()) {
      ifs.read(&buffer[0], sizeof(buffer));
      s.append(buffer, checkOverflow(ifs.gcount()));
    }
  }
  ifs.close();

  if (hex) {
    s = convertFromHex(s);
  }

  Options options;
  options.prettyPrint = pretty;
  options.checkAttributeUniqueness = true;
  options.validateUtf8Strings = true;
  options.unsupportedTypeBehavior =
      (printUnsupported ? Options::ConvertUnsupportedType
                        : Options::FailOnUnsupportedType);

  if (validate) {
    Validator validator(&options);
    validator.validate(reinterpret_cast<uint8_t const*>(s.data()), s.size(),
                       false);
  }

  Slice const slice(reinterpret_cast<uint8_t const*>(s.data()));

  Buffer<char> buffer(4096);
  CharBufferSink sink(&buffer);
  Dumper dumper(&sink, &options);

  try {
    dumper.dump(slice);
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while processing infile '" << infile
              << "': " << ex.what() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while processing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  std::ofstream ofs(outfileName, std::ofstream::out);

  if (!ofs.is_open()) {
    std::cerr << "Cannot write outfile '" << outfileName << "'" << std::endl;
    return EXIT_FAILURE;
  }

  // reset stream
  if (!toStdOut) {
    ofs.seekp(0);
  }

  // write into stream
  char const* start = buffer.data();
  ofs.write(start, buffer.size());

  ofs.close();

  if (!toStdOut) {
    std::cout << "Successfully converted JSON infile '" << infile << "'"
              << std::endl;
    std::cout << "VPack Infile size: " << s.size() << std::endl;
    std::cout << "JSON Outfile size: " << buffer.size() << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}